

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O2

int parse_int(char *arg,char *what)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong uVar3;
  undefined8 uVar4;
  int extraout_EDX;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_60;
  nng_socket nStack_54;
  char *pcStack_50;
  char *local_20;
  char *eptr;
  
  uVar3 = strtol(arg,&local_20,10);
  if (((uVar3 < 0x3b9aca01) && (local_20 != arg)) && (*local_20 == '\0')) {
    return (int)uVar3;
  }
  pcVar5 = "Invalid %s";
  pcVar6 = what;
  die("Invalid %s");
  pcStack_50 = what;
  iVar1 = (*open_server)(&nStack_54);
  if (iVar1 != 0) goto LAB_00101c15;
  iVar1 = nng_listen(nStack_54.id,pcVar5,0,0);
  if (iVar1 == 0) {
    iVar1 = extraout_EDX;
    if (extraout_EDX < 1) {
      iVar1 = 0;
    }
    iVar1 = iVar1 + 1;
    do {
      iVar1 = iVar1 + -1;
      if (iVar1 == 0) {
        nng_msleep(100);
        iVar1 = nng_socket_close(nStack_54.id);
        return iVar1;
      }
      iVar2 = nng_recvmsg(nStack_54.id,&uStack_60,0);
      if (iVar2 != 0) {
LAB_00101bfd:
        uVar4 = nng_strerror(iVar2);
        pcVar6 = "nng_recvmsg: %s";
        goto LAB_00101c0b;
      }
      pcVar5 = (char *)nng_msg_len(uStack_60);
      if (pcVar5 != pcVar6) {
        uVar4 = nng_msg_len(uStack_60);
        die("wrong message size: %lu != %lu",uVar4,pcVar6);
        iVar2 = extraout_EAX;
        goto LAB_00101bfd;
      }
      iVar2 = nng_sendmsg(nStack_54.id,uStack_60,0);
    } while (iVar2 == 0);
    uVar4 = nng_strerror(iVar2);
    pcVar6 = "nng_sendmsg: %s";
  }
  else {
    uVar4 = nng_strerror(iVar1);
    pcVar6 = "nng_listen: %s";
  }
LAB_00101c0b:
  do {
    die(pcVar6,uVar4);
    iVar1 = extraout_EAX_00;
LAB_00101c15:
    uVar4 = nng_strerror(iVar1);
    pcVar6 = "nng_socket: %s";
  } while( true );
}

Assistant:

static int
parse_int(const char *arg, const char *what)
{
	long  val;
	char *eptr;

	val = strtol(arg, &eptr, 10);
	// Must be a positive number less than around a billion.
	if ((val < 0) || (val > 1000000000) || (*eptr != 0) || (eptr == arg)) {
		die("Invalid %s", what);
	}
	return ((int) val);
}